

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O1

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::crossover(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
            *this)

{
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  local_48;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  local_28;
  
  DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>::crossover
            (&local_28,(DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_> *)this,
             &this->_fittestChromosomes);
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_fittestChromosomes).
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_28.
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_28.
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_fittestChromosomes).
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.
       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&local_48);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void crossover()
    {
        _fittestChromosomes = CrossoverPolicy::crossover(_fittestChromosomes);
    }